

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char,std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,char *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  string_view local_70;
  string *local_60;
  cmAlphaNum local_58;
  
  local_c0.Digits_[0] = *a;
  local_c0.View_._M_str = local_c0.Digits_;
  local_c0.RValueString_ = (string *)0x0;
  local_c0.View_._M_len = 1;
  local_88.first = cmAlphaNum::View(&local_c0);
  local_88.second = local_c0.RValueString_;
  local_58.RValueString_ = (string *)0x0;
  local_58.View_._M_str = (b->_M_dataplus)._M_p;
  local_58.View_._M_len = b->_M_string_length;
  local_70 = cmAlphaNum::View(&local_58);
  local_60 = local_58.RValueString_;
  views._M_len = 2;
  views._M_array = &local_88;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}